

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O3

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  d_derived_tbl *htbl;
  jpeg_source_mgr *pjVar3;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int bits_left;
  int iVar8;
  int iVar9;
  _func_void_j_decompress_ptr *get_buffer;
  uint nbits;
  int iVar10;
  uint nbits_00;
  bitread_working_state br_state;
  bitread_working_state local_68;
  JBLOCKROW local_40;
  int *local_38;
  
  pjVar2 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar2[3].decode_mcu != 0)) ||
     (bVar4 = process_restart(cinfo), bVar4 != 0)) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      if (*(int *)&pjVar2[2].start_pass == 0) {
        iVar8 = cinfo->Se;
        iVar1 = cinfo->Al;
        local_38 = cinfo->natural_order;
        local_68.next_input_byte = cinfo->src->next_input_byte;
        local_68.bytes_in_buffer = cinfo->src->bytes_in_buffer;
        get_buffer = pjVar2[1].start_pass;
        bits_left = *(int *)&pjVar2[1].decode_mcu;
        iVar9 = cinfo->Ss;
        if (iVar9 <= iVar8) {
          local_40 = *MCU_data;
          htbl = (d_derived_tbl *)pjVar2[6].start_pass;
          local_68.cinfo = cinfo;
          do {
            if (bits_left < 8) {
              bVar4 = jpeg_fill_bit_buffer(&local_68,(bit_buf_type)get_buffer,bits_left,0);
              if (bVar4 == 0) {
                return 0;
              }
              get_buffer = (_func_void_j_decompress_ptr *)local_68.get_buffer;
              bits_left = local_68.bits_left;
              if (7 < local_68.bits_left) goto LAB_0027fbf9;
              iVar10 = 1;
LAB_0027fc2e:
              uVar5 = jpeg_huff_decode(&local_68,(bit_buf_type)get_buffer,bits_left,htbl,iVar10);
              get_buffer = (_func_void_j_decompress_ptr *)local_68.get_buffer;
              bits_left = local_68.bits_left;
              if ((int)uVar5 < 0) goto LAB_0027fd6d;
            }
            else {
LAB_0027fbf9:
              uVar7 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
              if (htbl->look_nbits[uVar7] == 0) {
                iVar10 = 9;
                goto LAB_0027fc2e;
              }
              uVar5 = (uint)htbl->look_sym[uVar7];
              bits_left = bits_left - htbl->look_nbits[uVar7];
            }
            nbits = uVar5 >> 4;
            nbits_00 = uVar5 & 0xf;
            if (nbits_00 == 0) {
              if (nbits != 0xf) {
                iVar8 = 1 << ((byte)nbits & 0x1f);
                if (0xf < uVar5) {
                  if ((bits_left < (int)nbits) &&
                     (bVar4 = jpeg_fill_bit_buffer
                                        (&local_68,(bit_buf_type)get_buffer,bits_left,nbits),
                     get_buffer = (_func_void_j_decompress_ptr *)local_68.get_buffer,
                     bits_left = local_68.bits_left, bVar4 == 0)) goto LAB_0027fd6d;
                  bits_left = bits_left - nbits;
                  iVar8 = ((uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[nbits]) +
                          iVar8;
                }
                iVar8 = iVar8 + -1;
                goto LAB_0027fcdf;
              }
              iVar10 = iVar9 + 0xf;
            }
            else {
              if ((bits_left < (int)nbits_00) &&
                 (bVar4 = jpeg_fill_bit_buffer
                                    (&local_68,(bit_buf_type)get_buffer,bits_left,nbits_00),
                 get_buffer = (_func_void_j_decompress_ptr *)local_68.get_buffer,
                 bits_left = local_68.bits_left, bVar4 == 0)) goto LAB_0027fd6d;
              bits_left = bits_left - nbits_00;
              uVar6 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[nbits_00];
              uVar5 = 0;
              if ((int)uVar6 <= bmask[nbits_00 - 1]) {
                uVar5 = bmask[nbits_00];
              }
              iVar10 = nbits + iVar9;
              (*local_40)[local_38[iVar10]] = (JCOEF)(uVar6 - uVar5 << ((byte)iVar1 & 0x1f));
            }
            iVar9 = iVar10 + 1;
          } while (iVar10 < iVar8);
        }
        iVar8 = 0;
LAB_0027fcdf:
        pjVar3 = cinfo->src;
        pjVar3->next_input_byte = local_68.next_input_byte;
        pjVar3->bytes_in_buffer = local_68.bytes_in_buffer;
        pjVar2[1].start_pass = get_buffer;
        *(int *)&pjVar2[1].decode_mcu = bits_left;
      }
      else {
        iVar8 = *(int *)&pjVar2[2].start_pass + -1;
      }
      *(int *)&pjVar2[2].start_pass = iVar8;
    }
    *(int *)&pjVar2[3].decode_mcu = *(int *)&pjVar2[3].decode_mcu + -1;
    bVar4 = 1;
  }
  else {
LAB_0027fd6d:
    bVar4 = 0;
  }
  return bVar4;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    Al = cinfo->Al;
    natural_order = cinfo->natural_order;

    /* Load up working state.
     * We can avoid loading/saving bitread state if in an EOB run.
     */
    EOBRUN = entropy->saved.EOBRUN;	/* only part of saved state we need */

    /* There is always only one block per MCU */

    if (EOBRUN > 0)		/* if it's a band of zeroes... */
      EOBRUN--;			/* ...process it now (we do nothing) */
    else {
      BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
      block = MCU_data[0];
      tbl = entropy->ac_derived_tbl;

      for (k = cinfo->Ss; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, return FALSE, label2);
	r = s >> 4;
	s &= 15;
	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	  /* Scale and output coefficient in natural (dezigzagged) order */
	  (*block)[natural_order[k]] = (JCOEF) (s << Al);
	} else {
	  if (r == 15) {	/* ZRL */
	    k += 15;		/* skip 15 zeroes in band */
	  } else {		/* EOBr, run length is 2^r + appended bits */
	    EOBRUN = 1 << r;
	    if (r) {		/* EOBr, r > 0 */
	      CHECK_BIT_BUFFER(br_state, r, return FALSE);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    EOBRUN--;		/* this band is processed at this moment */
	    break;		/* force end-of-band */
	  }
	}
      }

      BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    }

    /* Completed MCU, so update state */
    entropy->saved.EOBRUN = EOBRUN;	/* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}